

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgraphelq3dd.cpp
# Opt level: O0

int __thiscall TPZGraphElQ3dd::ExportType(TPZGraphElQ3dd *this,TPZDrawStyle st)

{
  TPZDrawStyle st_local;
  TPZGraphElQ3dd *this_local;
  undefined4 local_4;
  
  if (st == EVTKStyle) {
    local_4 = 0xc;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int TPZGraphElQ3dd::ExportType(TPZDrawStyle st){
	switch(st)
	{
		case(EVTKStyle):
			return 12;//vtk_hexahedron
			//		break;
		default:
			return -1;
	}
	//	return -1;
}